

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::OP_NewScObjectLiteral_LS
          (InterpreterStackFrame *this,OpLayoutAuxiliary *playout,RegSlot *target)

{
  ScriptContext *scriptContext;
  PropertyIdArray *propIds;
  Type *literalType;
  Var value;
  
  propIds = ByteCodeReader::ReadPropertyIdArray
                      ((playout->super_OpLayoutAuxNoReg).Offset,*(FunctionBody **)(this + 0x88));
  *target = playout->R0;
  scriptContext = *(ScriptContext **)(this + 0x78);
  literalType = FunctionBody::GetObjectLiteralTypeRef
                          (*(FunctionBody **)(this + 0x88),(playout->super_OpLayoutAuxNoReg).C1);
  value = JavascriptOperators::NewScObjectLiteral(scriptContext,propIds,literalType);
  SetReg<unsigned_int>(this,playout->R0,value);
  *target = 0xffffffff;
  return;
}

Assistant:

void InterpreterStackFrame::OP_NewScObjectLiteral_LS(const unaligned OpLayoutAuxiliary * playout, RegSlot& target)
    {
        const Js::PropertyIdArray *propIds = Js::ByteCodeReader::ReadPropertyIdArray(playout->Offset, this->GetFunctionBody());

        target = playout->R0;

        Var newObj = JavascriptOperators::NewScObjectLiteral(GetScriptContext(), propIds,
            this->GetFunctionBody()->GetObjectLiteralTypeRef(playout->C1));

        SetReg(playout->R0, newObj);

        target = Js::Constants::NoRegister;
    }